

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server.cpp
# Opt level: O0

void __thiscall EchoServer::EchoServer(EchoServer *this,EventLoop *loop,char *ip,uint16_t port)

{
  anon_class_8_1_8991fb9c local_b0;
  CloseCallback local_a8;
  anon_class_8_1_8991fb9c local_88;
  MessageCallback local_80;
  anon_class_8_1_8991fb9c local_50;
  ConnectionCallback local_48;
  uint16_t local_22;
  char *pcStack_20;
  uint16_t port_local;
  char *ip_local;
  EventLoop *loop_local;
  EchoServer *this_local;
  
  local_22 = port;
  pcStack_20 = ip;
  ip_local = (char *)loop;
  loop_local = (EventLoop *)this;
  TcpServer::TcpServer(&this->es_server,loop,ip,port);
  this->es_loop = (EventLoop *)ip_local;
  local_50.this = this;
  std::function<void(std::shared_ptr<TcpConnection>const&)>::
  function<EchoServer::EchoServer(EventLoop*,char_const*,unsigned_short)::_lambda(std::shared_ptr<TcpConnection>const&)_1_,void>
            ((function<void(std::shared_ptr<TcpConnection>const&)> *)&local_48,&local_50);
  TcpServer::set_connected_cb(&this->es_server,&local_48);
  std::function<void_(const_std::shared_ptr<TcpConnection>_&)>::~function(&local_48);
  local_88.this = this;
  std::function<void(std::shared_ptr<TcpConnection>const&,InputBuffer*)>::
  function<EchoServer::EchoServer(EventLoop*,char_const*,unsigned_short)::_lambda(std::shared_ptr<TcpConnection>const&,InputBuffer*)_1_,void>
            ((function<void(std::shared_ptr<TcpConnection>const&,InputBuffer*)> *)&local_80,
             &local_88);
  TcpServer::set_message_cb(&this->es_server,&local_80);
  std::function<void_(const_std::shared_ptr<TcpConnection>_&,_InputBuffer_*)>::~function(&local_80);
  local_b0.this = this;
  std::function<void()>::
  function<EchoServer::EchoServer(EventLoop*,char_const*,unsigned_short)::_lambda()_1_,void>
            ((function<void()> *)&local_a8,&local_b0);
  TcpServer::set_close_cb(&this->es_server,&local_a8);
  std::function<void_()>::~function(&local_a8);
  return;
}

Assistant:

EchoServer(EventLoop* loop, const char *ip, uint16_t port) :
            es_loop(loop), es_server(loop, ip, port) 
    {
        es_server.set_connected_cb([this](const TcpConnSP& conn){ this->echo_conneted_cb(conn); });
        es_server.set_message_cb([this](const TcpConnSP& conn, InputBuffer* ibuf){ this->echo_message_cb(conn, ibuf); });
        es_server.set_close_cb([this](){ this->echo_close_cb(); });
    }